

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core-test.cc
# Opt level: O3

void __thiscall
mock_visitor<fmt::v5::monostate>::mock_visitor(mock_visitor<fmt::v5::monostate> *this)

{
  MockSpec<test_result_(fmt::v5::monostate)> *this_00;
  OnCallSpec<test_result_(fmt::v5::monostate)> *this_01;
  linked_ptr<testing::ActionInterface<test_result_(fmt::v5::monostate)>_> local_48;
  Matcher<fmt::v5::monostate> local_38;
  
  testing::internal::UntypedFunctionMockerBase::UntypedFunctionMockerBase
            ((UntypedFunctionMockerBase *)this);
  (this->gmock1_visit_268).super_FunctionMockerBase<test_result_(fmt::v5::monostate)>.current_spec_.
  function_mocker_ = (FunctionMockerBase<test_result_(fmt::v5::monostate)> *)this;
  (this->gmock1_visit_268).super_FunctionMockerBase<test_result_(fmt::v5::monostate)>.current_spec_.
  matchers_.f0_.super_MatcherBase<fmt::v5::monostate>.impl_.value_ =
       (MatcherInterface<fmt::v5::monostate> *)0x0;
  ((linked_ptr_internal *)
  ((long)&(this->gmock1_visit_268).super_FunctionMockerBase<test_result_(fmt::v5::monostate)>.
          current_spec_.matchers_.f0_.super_MatcherBase<fmt::v5::monostate>.impl_ + 8))->next_ =
       (linked_ptr_internal *)
       ((long)&(this->gmock1_visit_268).super_FunctionMockerBase<test_result_(fmt::v5::monostate)>.
               current_spec_.matchers_.f0_.super_MatcherBase<fmt::v5::monostate>.impl_ + 8);
  (this->gmock1_visit_268).super_FunctionMockerBase<test_result_(fmt::v5::monostate)>.current_spec_.
  matchers_.f0_.super_MatcherBase<fmt::v5::monostate>._vptr_MatcherBase =
       (_func_int **)&PTR__MatcherBase_001d8ab8;
  (this->gmock1_visit_268).super_FunctionMockerBase<test_result_(fmt::v5::monostate)>.
  super_UntypedFunctionMockerBase._vptr_UntypedFunctionMockerBase =
       (_func_int **)&PTR__FunctionMockerBase_001d89e8;
  testing::internal::UntypedFunctionMockerBase::UntypedFunctionMockerBase
            ((UntypedFunctionMockerBase *)&this->gmock0_unexpected_269);
  (this->gmock0_unexpected_269).super_FunctionMockerBase<void_()>.current_spec_.function_mocker_ =
       &(this->gmock0_unexpected_269).super_FunctionMockerBase<void_()>;
  (this->gmock0_unexpected_269).super_FunctionMockerBase<void_()>.super_UntypedFunctionMockerBase.
  _vptr_UntypedFunctionMockerBase = (_func_int **)&PTR__FunctionMockerBase_001d4680;
  local_38.super_MatcherBase<fmt::v5::monostate>.impl_.value_ =
       (MatcherInterface<fmt::v5::monostate> *)operator_new(8);
  ((local_38.super_MatcherBase<fmt::v5::monostate>.impl_.value_)->super_MatcherDescriberInterface).
  _vptr_MatcherDescriberInterface = (_func_int **)&PTR__MatcherDescriberInterface_001d8c10;
  local_38.super_MatcherBase<fmt::v5::monostate>.impl_.link_.next_ =
       &local_38.super_MatcherBase<fmt::v5::monostate>.impl_.link_;
  local_38.super_MatcherBase<fmt::v5::monostate>._vptr_MatcherBase =
       (_func_int **)&PTR__MatcherBase_001d8ab8;
  testing::internal::UntypedFunctionMockerBase::RegisterOwner
            ((UntypedFunctionMockerBase *)this,this);
  this_00 = testing::internal::FunctionMocker<test_result_(fmt::v5::monostate)>::With
                      (&this->gmock1_visit_268,&local_38);
  this_01 = testing::internal::MockSpec<test_result_(fmt::v5::monostate)>::
            InternalDefaultActionSetAt
                      (this_00,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/core-test.cc"
                       ,0x109,"*this","visit(_)");
  local_48.value_ = (ActionInterface<test_result_(fmt::v5::monostate)> *)operator_new(0x10);
  (local_48.value_)->_vptr_ActionInterface = (_func_int **)&PTR__ActionInterface_001d8bc0;
  local_48.link_.next_ = &local_48.link_;
  testing::internal::OnCallSpec<test_result_(fmt::v5::monostate)>::WillByDefault
            (this_01,(Action<test_result_(fmt::v5::monostate)> *)&local_48);
  testing::internal::linked_ptr<testing::ActionInterface<test_result_(fmt::v5::monostate)>_>::
  ~linked_ptr(&local_48);
  local_38.super_MatcherBase<fmt::v5::monostate>._vptr_MatcherBase =
       (_func_int **)&PTR__MatcherBase_001d41d8;
  testing::internal::linked_ptr<const_testing::MatcherInterface<fmt::v5::monostate>_>::~linked_ptr
            (&local_38.super_MatcherBase<fmt::v5::monostate>.impl_);
  return;
}

Assistant:

mock_visitor() {
    ON_CALL(*this, visit(_)).WillByDefault(testing::Return(test_result()));
  }